

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall Minisat::ClauseAllocator::reloc(ClauseAllocator *this,CRef *cr,ClauseAllocator *to)

{
  Clause *from;
  Clause CVar1;
  
  if (*cr < (this->ra).sz) {
    from = (Clause *)((this->ra).memory + *cr);
    if (((uint)from->header & 0x10) == 0) {
      CVar1.header = (anon_struct_4_5_613047fb_for_header)alloc(to,from);
      *cr = (CRef)CVar1.header;
      *(byte *)&from->header = *(byte *)&from->header | 0x10;
      from[1].header = CVar1.header;
    }
    else {
      *cr = (CRef)from[1].header;
    }
    return;
  }
  __assert_fail("r < sz",
                "/workspace/llm4binary/github/license_c_cmakelists/lakshayg[P]sudoku/minisat/minisat/mtl/Alloc.h"
                ,0x3f,
                "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]");
}

Assistant:

void reloc(CRef& cr, ClauseAllocator& to)
    {
        Clause& c = operator[](cr);
        
        if (c.reloced()) { cr = c.relocation(); return; }
        
        cr = to.alloc(c);
        c.relocate(cr);
    }